

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O0

int Scl_LibertyReadTable
              (Scl_Tree_t *p,Vec_Str_t *vOut,Scl_Item_t *pTiming,char *pName,Vec_Ptr_t *vTemples)

{
  Vec_Flt_t *pVVar1;
  Vec_Flt_t *p_00;
  Scl_Item_t *pSVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  char *__s2;
  void *pvVar7;
  float fVar8;
  Vec_Flt_t *local_140;
  Vec_Flt_t *local_138;
  Vec_Flt_t *local_f0;
  Vec_Flt_t *local_e8;
  int y;
  int x;
  float Entry;
  int i;
  int iPlace;
  char *pTempl;
  char *pThis;
  Scl_Item_t *pTable;
  Scl_Item_t *pItem;
  Vec_Flt_t *vInd2;
  Vec_Flt_t *vInd1;
  Vec_Flt_t *vValues;
  Vec_Flt_t *vIndex2;
  Vec_Flt_t *vIndex1;
  Vec_Ptr_t *vTemples_local;
  char *pName_local;
  Scl_Item_t *pTiming_local;
  Vec_Str_t *vOut_local;
  Scl_Tree_t *p_local;
  
  vIndex2 = (Vec_Flt_t *)0x0;
  vValues = (Vec_Flt_t *)0x0;
  vInd1 = (Vec_Flt_t *)0x0;
  vIndex1 = (Vec_Flt_t *)vTemples;
  vTemples_local = (Vec_Ptr_t *)pName;
  pName_local = (char *)pTiming;
  pTiming_local = (Scl_Item_t *)vOut;
  vOut_local = (Vec_Str_t *)p;
  pThis = (char *)Scl_LibertyItem(p,pTiming->Child);
  while ((pThis != (char *)0x0 &&
         (iVar3 = Scl_LibertyCompare((Scl_Tree_t *)vOut_local,*(Scl_Pair_t *)(pThis + 8),
                                     (char *)vTemples_local), iVar3 != 0))) {
    pThis = (char *)Scl_LibertyItem((Scl_Tree_t *)vOut_local,*(int *)(pThis + 0x20));
  }
  if (pThis == (char *)0x0) {
    p_local._4_4_ = 0;
  }
  else {
    pcVar6 = Scl_LibertyReadString((Scl_Tree_t *)vOut_local,*(Scl_Pair_t *)(pThis + 0x10));
    if ((pcVar6 == (char *)0x0) || (*pcVar6 == '\0')) {
      for (pTable = Scl_LibertyItem((Scl_Tree_t *)vOut_local,*(int *)(pThis + 0x24));
          pSVar2 = pTiming_local, p_00 = vIndex2, pVVar1 = vValues, pTable != (Scl_Item_t *)0x0;
          pTable = Scl_LibertyItem((Scl_Tree_t *)vOut_local,pTable->Next)) {
        iVar3 = Scl_LibertyCompare((Scl_Tree_t *)vOut_local,pTable->Key,"index_1");
        if (iVar3 == 0) {
          if (vIndex2 != (Vec_Flt_t *)0x0) {
            __assert_fail("vIndex1 == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLiberty.c"
                          ,0x4d1,
                          "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                         );
          }
          pcVar6 = Scl_LibertyReadString((Scl_Tree_t *)vOut_local,pTable->Head);
          vIndex2 = Scl_LibertyReadFloatVec(pcVar6);
        }
        else {
          iVar3 = Scl_LibertyCompare((Scl_Tree_t *)vOut_local,pTable->Key,"index_2");
          if (iVar3 == 0) {
            if (vValues != (Vec_Flt_t *)0x0) {
              __assert_fail("vIndex2 == NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLiberty.c"
                            ,0x4d3,
                            "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                           );
            }
            pcVar6 = Scl_LibertyReadString((Scl_Tree_t *)vOut_local,pTable->Head);
            vValues = Scl_LibertyReadFloatVec(pcVar6);
          }
          else {
            iVar3 = Scl_LibertyCompare((Scl_Tree_t *)vOut_local,pTable->Key,"values");
            if (iVar3 == 0) {
              if (vInd1 != (Vec_Flt_t *)0x0) {
                __assert_fail("vValues == NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLiberty.c"
                              ,0x4d5,
                              "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                             );
              }
              pcVar6 = Scl_LibertyReadString((Scl_Tree_t *)vOut_local,pTable->Head);
              vInd1 = Scl_LibertyReadFloatVec(pcVar6);
            }
          }
        }
      }
      if (((vIndex2 == (Vec_Flt_t *)0x0) || (vValues == (Vec_Flt_t *)0x0)) ||
         (vInd1 == (Vec_Flt_t *)0x0)) {
        printf("Incomplete table specification\n");
        return 0;
      }
      iVar3 = Vec_FltSize(vIndex2);
      Vec_StrPutI_((Vec_Str_t *)pSVar2,iVar3);
      for (x = 0; iVar3 = Vec_FltSize(p_00), x < iVar3; x = x + 1) {
        fVar8 = Vec_FltEntry(p_00,x);
        Vec_StrPutF_((Vec_Str_t *)pTiming_local,fVar8);
      }
      Vec_StrPut_((Vec_Str_t *)pTiming_local);
      pSVar2 = pTiming_local;
      iVar3 = Vec_FltSize(pVVar1);
      Vec_StrPutI_((Vec_Str_t *)pSVar2,iVar3);
      for (x = 0; iVar3 = Vec_FltSize(pVVar1), x < iVar3; x = x + 1) {
        fVar8 = Vec_FltEntry(pVVar1,x);
        Vec_StrPutF_((Vec_Str_t *)pTiming_local,fVar8);
      }
      Vec_StrPut_((Vec_Str_t *)pTiming_local);
      Vec_StrPut_((Vec_Str_t *)pTiming_local);
      iVar3 = Vec_FltSize(p_00);
      iVar4 = Vec_FltSize(pVVar1);
      iVar5 = Vec_FltSize(vInd1);
      if (iVar3 * iVar4 != iVar5) {
        __assert_fail("Vec_FltSize(vInd1) * Vec_FltSize(vInd2) == Vec_FltSize(vValues)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLiberty.c"
                      ,0x4e8,
                      "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                     );
      }
      for (x = 0; iVar3 = Vec_FltSize(vInd1), x < iVar3; x = x + 1) {
        fVar8 = Vec_FltEntry(vInd1,x);
        Vec_StrPutF_((Vec_Str_t *)pTiming_local,fVar8);
        iVar3 = Vec_FltSize(pVVar1);
        iVar4 = Vec_FltSize(pVVar1);
        if (x % iVar3 == iVar4 + -1) {
          Vec_StrPut_((Vec_Str_t *)pTiming_local);
        }
      }
    }
    else {
      Entry = -NAN;
      for (x = 0; iVar3 = Vec_PtrSize((Vec_Ptr_t *)vIndex1), x < iVar3; x = x + 1) {
        __s2 = (char *)Vec_PtrEntry((Vec_Ptr_t *)vIndex1,x);
        if ((x % 4 == 0) && (iVar3 = strcmp(pcVar6,__s2), iVar3 == 0)) {
          Entry = (float)x;
          break;
        }
      }
      if (Entry == -NAN) {
        printf("Template cannot be found in the template library\n");
        return 0;
      }
      for (pTable = Scl_LibertyItem((Scl_Tree_t *)vOut_local,*(int *)(pThis + 0x24));
          pTable != (Scl_Item_t *)0x0;
          pTable = Scl_LibertyItem((Scl_Tree_t *)vOut_local,pTable->Next)) {
        iVar3 = Scl_LibertyCompare((Scl_Tree_t *)vOut_local,pTable->Key,"index_1");
        if (iVar3 == 0) {
          if (vIndex2 != (Vec_Flt_t *)0x0) {
            __assert_fail("vIndex1 == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLiberty.c"
                          ,0x500,
                          "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                         );
          }
          pcVar6 = Scl_LibertyReadString((Scl_Tree_t *)vOut_local,pTable->Head);
          vIndex2 = Scl_LibertyReadFloatVec(pcVar6);
        }
        else {
          iVar3 = Scl_LibertyCompare((Scl_Tree_t *)vOut_local,pTable->Key,"index_2");
          if (iVar3 == 0) {
            if (vValues != (Vec_Flt_t *)0x0) {
              __assert_fail("vIndex2 == NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLiberty.c"
                            ,0x502,
                            "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                           );
            }
            pcVar6 = Scl_LibertyReadString((Scl_Tree_t *)vOut_local,pTable->Head);
            vValues = Scl_LibertyReadFloatVec(pcVar6);
          }
          else {
            iVar3 = Scl_LibertyCompare((Scl_Tree_t *)vOut_local,pTable->Key,"values");
            if (iVar3 == 0) {
              if (vInd1 != (Vec_Flt_t *)0x0) {
                __assert_fail("vValues == NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLiberty.c"
                              ,0x504,
                              "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                             );
              }
              pcVar6 = Scl_LibertyReadString((Scl_Tree_t *)vOut_local,pTable->Head);
              vInd1 = Scl_LibertyReadFloatVec(pcVar6);
            }
          }
        }
      }
      local_138 = (Vec_Flt_t *)Vec_PtrEntry((Vec_Ptr_t *)vIndex1,(int)Entry + 2);
      local_140 = (Vec_Flt_t *)Vec_PtrEntry((Vec_Ptr_t *)vIndex1,(int)Entry + 3);
      pvVar7 = Vec_PtrEntry((Vec_Ptr_t *)vIndex1,(int)Entry + 1);
      if (pvVar7 == (void *)0x0) {
        if (vIndex2 != (Vec_Flt_t *)0x0) {
          iVar3 = Vec_FltSize(vIndex2);
          iVar4 = Vec_FltSize(local_138);
          if (iVar3 != iVar4) {
            __assert_fail("!vIndex1 || Vec_FltSize(vIndex1) == Vec_FltSize(vInd1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLiberty.c"
                          ,0x50b,
                          "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                         );
          }
        }
        if (vValues != (Vec_Flt_t *)0x0) {
          iVar3 = Vec_FltSize(vValues);
          iVar4 = Vec_FltSize(local_140);
          if (iVar3 != iVar4) {
            __assert_fail("!vIndex2 || Vec_FltSize(vIndex2) == Vec_FltSize(vInd2)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLiberty.c"
                          ,0x50c,
                          "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                         );
          }
        }
        pSVar2 = pTiming_local;
        local_e8 = local_138;
        if (vIndex2 != (Vec_Flt_t *)0x0) {
          local_e8 = vIndex2;
        }
        local_f0 = local_140;
        if (vValues != (Vec_Flt_t *)0x0) {
          local_f0 = vValues;
        }
        iVar3 = Vec_FltSize(local_e8);
        Vec_StrPutI_((Vec_Str_t *)pSVar2,iVar3);
        for (x = 0; iVar3 = Vec_FltSize(local_e8), x < iVar3; x = x + 1) {
          fVar8 = Vec_FltEntry(local_e8,x);
          Vec_StrPutF_((Vec_Str_t *)pTiming_local,fVar8);
        }
        Vec_StrPut_((Vec_Str_t *)pTiming_local);
        pSVar2 = pTiming_local;
        iVar3 = Vec_FltSize(local_f0);
        Vec_StrPutI_((Vec_Str_t *)pSVar2,iVar3);
        for (x = 0; iVar3 = Vec_FltSize(local_f0), x < iVar3; x = x + 1) {
          fVar8 = Vec_FltEntry(local_f0,x);
          Vec_StrPutF_((Vec_Str_t *)pTiming_local,fVar8);
        }
        Vec_StrPut_((Vec_Str_t *)pTiming_local);
        Vec_StrPut_((Vec_Str_t *)pTiming_local);
        iVar3 = Vec_FltSize(local_e8);
        iVar4 = Vec_FltSize(local_f0);
        iVar5 = Vec_FltSize(vInd1);
        if (iVar3 * iVar4 != iVar5) {
          __assert_fail("Vec_FltSize(vInd1) * Vec_FltSize(vInd2) == Vec_FltSize(vValues)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLiberty.c"
                        ,0x51b,
                        "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                       );
        }
        for (x = 0; iVar3 = Vec_FltSize(vInd1), x < iVar3; x = x + 1) {
          fVar8 = Vec_FltEntry(vInd1,x);
          Vec_StrPutF_((Vec_Str_t *)pTiming_local,fVar8);
          iVar3 = Vec_FltSize(local_f0);
          iVar4 = Vec_FltSize(local_f0);
          if (x % iVar3 == iVar4 + -1) {
            Vec_StrPut_((Vec_Str_t *)pTiming_local);
          }
        }
      }
      else {
        if (vValues != (Vec_Flt_t *)0x0) {
          iVar3 = Vec_FltSize(vValues);
          iVar4 = Vec_FltSize(local_138);
          if (iVar3 != iVar4) {
            __assert_fail("!vIndex2 || Vec_FltSize(vIndex2) == Vec_FltSize(vInd1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLiberty.c"
                          ,0x525,
                          "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                         );
          }
        }
        if (vIndex2 != (Vec_Flt_t *)0x0) {
          iVar3 = Vec_FltSize(vIndex2);
          iVar4 = Vec_FltSize(local_140);
          if (iVar3 != iVar4) {
            __assert_fail("!vIndex1 || Vec_FltSize(vIndex1) == Vec_FltSize(vInd2)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLiberty.c"
                          ,0x526,
                          "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                         );
          }
        }
        pSVar2 = pTiming_local;
        if (vValues != (Vec_Flt_t *)0x0) {
          local_138 = vValues;
        }
        if (vIndex2 != (Vec_Flt_t *)0x0) {
          local_140 = vIndex2;
        }
        iVar3 = Vec_FltSize(local_138);
        Vec_StrPutI_((Vec_Str_t *)pSVar2,iVar3);
        for (x = 0; iVar3 = Vec_FltSize(local_138), x < iVar3; x = x + 1) {
          fVar8 = Vec_FltEntry(local_138,x);
          Vec_StrPutF_((Vec_Str_t *)pTiming_local,fVar8);
        }
        Vec_StrPut_((Vec_Str_t *)pTiming_local);
        pSVar2 = pTiming_local;
        iVar3 = Vec_FltSize(local_140);
        Vec_StrPutI_((Vec_Str_t *)pSVar2,iVar3);
        for (x = 0; iVar3 = Vec_FltSize(local_140), x < iVar3; x = x + 1) {
          fVar8 = Vec_FltEntry(local_140,x);
          Vec_StrPutF_((Vec_Str_t *)pTiming_local,fVar8);
        }
        Vec_StrPut_((Vec_Str_t *)pTiming_local);
        Vec_StrPut_((Vec_Str_t *)pTiming_local);
        iVar3 = Vec_FltSize(local_138);
        iVar4 = Vec_FltSize(local_140);
        iVar5 = Vec_FltSize(vInd1);
        if (iVar3 * iVar4 != iVar5) {
          __assert_fail("Vec_FltSize(vInd1) * Vec_FltSize(vInd2) == Vec_FltSize(vValues)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLiberty.c"
                        ,0x535,
                        "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                       );
        }
        for (x = 0; iVar3 = Vec_FltSize(vInd1), x < iVar3; x = x + 1) {
          Vec_FltEntry(vInd1,x);
          iVar3 = Vec_FltSize(local_140);
          iVar4 = Vec_FltSize(local_140);
          pVVar1 = vInd1;
          iVar5 = Vec_FltSize(local_138);
          fVar8 = Vec_FltEntry(pVVar1,(x % iVar3) * iVar5 + x / iVar4);
          Vec_StrPutF_((Vec_Str_t *)pTiming_local,fVar8);
          iVar3 = Vec_FltSize(local_140);
          iVar4 = Vec_FltSize(local_140);
          if (x % iVar3 == iVar4 + -1) {
            Vec_StrPut_((Vec_Str_t *)pTiming_local);
          }
        }
      }
    }
    Vec_StrPut_((Vec_Str_t *)pTiming_local);
    for (x = 0; x < 3; x = x + 1) {
      Vec_StrPutF_((Vec_Str_t *)pTiming_local,0.0);
    }
    for (x = 0; x < 4; x = x + 1) {
      Vec_StrPutF_((Vec_Str_t *)pTiming_local,0.0);
    }
    for (x = 0; x < 6; x = x + 1) {
      Vec_StrPutF_((Vec_Str_t *)pTiming_local,0.0);
    }
    Vec_FltFreeP(&vIndex2);
    Vec_FltFreeP(&vValues);
    Vec_FltFreeP(&vInd1);
    Vec_StrPut_((Vec_Str_t *)pTiming_local);
    Vec_StrPut_((Vec_Str_t *)pTiming_local);
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

int Scl_LibertyReadTable( Scl_Tree_t * p, Vec_Str_t * vOut, Scl_Item_t * pTiming, char * pName, Vec_Ptr_t * vTemples )
{
    Vec_Flt_t * vIndex1 = NULL;
    Vec_Flt_t * vIndex2 = NULL;
    Vec_Flt_t * vValues = NULL;
    Vec_Flt_t * vInd1, * vInd2;
    Scl_Item_t * pItem, * pTable = NULL;
    char * pThis, * pTempl = NULL;
    int iPlace, i;
    float Entry;
    // find the table
    Scl_ItemForEachChildName( p, pTiming, pTable, pName )
        break;
    if ( pTable == NULL )
        return 0;
    // find the template
    pTempl = Scl_LibertyReadString(p, pTable->Head);
    if ( pTempl == NULL || pTempl[0] == 0 )
    {
        // read the numbers
        Scl_ItemForEachChild( p, pTable, pItem )
        {
            if ( !Scl_LibertyCompare(p, pItem->Key, "index_1") )
                assert(vIndex1 == NULL), vIndex1 = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
            else if ( !Scl_LibertyCompare(p, pItem->Key, "index_2") )
                assert(vIndex2 == NULL), vIndex2 = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
            else if ( !Scl_LibertyCompare(p, pItem->Key, "values") )
                assert(vValues == NULL), vValues = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
        }
        if ( vIndex1 == NULL || vIndex2 == NULL || vValues == NULL )
            { printf( "Incomplete table specification\n" ); return 0; }
        // dump the table
        vInd1 = vIndex1;
        vInd2 = vIndex2;
        // write entries
        Vec_StrPutI_( vOut, Vec_FltSize(vInd1) );
        Vec_FltForEachEntry( vInd1, Entry, i )
            Vec_StrPutF_( vOut, Entry );
        Vec_StrPut_( vOut );
        // write entries
        Vec_StrPutI_( vOut, Vec_FltSize(vInd2) );
        Vec_FltForEachEntry( vInd2, Entry, i )
            Vec_StrPutF_( vOut, Entry );
        Vec_StrPut_( vOut );
        Vec_StrPut_( vOut );
        // write entries
        assert( Vec_FltSize(vInd1) * Vec_FltSize(vInd2) == Vec_FltSize(vValues) );
        Vec_FltForEachEntry( vValues, Entry, i )
        {
            Vec_StrPutF_( vOut, Entry );
            if ( i % Vec_FltSize(vInd2) == Vec_FltSize(vInd2)-1 )
                Vec_StrPut_( vOut );
        }
    }
    else
    {
        // fetch the template
        iPlace = -1;
        Vec_PtrForEachEntry( char *, vTemples, pThis, i )
            if ( i % 4 == 0 && !strcmp(pTempl, pThis) )
            {  
                iPlace = i;
                break;
            }
        if ( iPlace == -1 )
            { printf( "Template cannot be found in the template library\n" ); return 0; }
        // read the numbers
        Scl_ItemForEachChild( p, pTable, pItem )
        {
            if ( !Scl_LibertyCompare(p, pItem->Key, "index_1") )
                assert(vIndex1 == NULL), vIndex1 = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
            else if ( !Scl_LibertyCompare(p, pItem->Key, "index_2") )
                assert(vIndex2 == NULL), vIndex2 = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
            else if ( !Scl_LibertyCompare(p, pItem->Key, "values") )
                assert(vValues == NULL), vValues = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
        }
        // check the template style
        vInd1 = (Vec_Flt_t *)Vec_PtrEntry( vTemples, iPlace + 2 ); // slew
        vInd2 = (Vec_Flt_t *)Vec_PtrEntry( vTemples, iPlace + 3 ); // load
        if ( Vec_PtrEntry(vTemples, iPlace + 1) == NULL ) // normal order (vIndex1 is slew; vIndex2 is load)
        {
            assert( !vIndex1 || Vec_FltSize(vIndex1) == Vec_FltSize(vInd1) );
            assert( !vIndex2 || Vec_FltSize(vIndex2) == Vec_FltSize(vInd2) );
            vInd1 = vIndex1 ? vIndex1 : vInd1;
            vInd2 = vIndex2 ? vIndex2 : vInd2;
            // write entries
            Vec_StrPutI_( vOut, Vec_FltSize(vInd1) );
            Vec_FltForEachEntry( vInd1, Entry, i )
                Vec_StrPutF_( vOut, Entry );
            Vec_StrPut_( vOut );
            // write entries
            Vec_StrPutI_( vOut, Vec_FltSize(vInd2) );
            Vec_FltForEachEntry( vInd2, Entry, i )
                Vec_StrPutF_( vOut, Entry );
            Vec_StrPut_( vOut );
            Vec_StrPut_( vOut );
            // write entries
            assert( Vec_FltSize(vInd1) * Vec_FltSize(vInd2) == Vec_FltSize(vValues) );
            Vec_FltForEachEntry( vValues, Entry, i )
            {
                Vec_StrPutF_( vOut, Entry );
                if ( i % Vec_FltSize(vInd2) == Vec_FltSize(vInd2)-1 )
                    Vec_StrPut_( vOut );
            }
        }
        else  // reverse order (vIndex2 is slew; vIndex1 is load)
        {
            assert( !vIndex2 || Vec_FltSize(vIndex2) == Vec_FltSize(vInd1) );
            assert( !vIndex1 || Vec_FltSize(vIndex1) == Vec_FltSize(vInd2) );
            vInd1 = vIndex2 ? vIndex2 : vInd1;
            vInd2 = vIndex1 ? vIndex1 : vInd2;
            // write entries
            Vec_StrPutI_( vOut, Vec_FltSize(vInd1) );
            Vec_FltForEachEntry( vInd1, Entry, i )
                Vec_StrPutF_( vOut, Entry );
            Vec_StrPut_( vOut );
            // write entries
            Vec_StrPutI_( vOut, Vec_FltSize(vInd2) );
            Vec_FltForEachEntry( vInd2, Entry, i )
                Vec_StrPutF_( vOut, Entry );
            Vec_StrPut_( vOut );
            Vec_StrPut_( vOut );
            // write entries -- transpose
            assert( Vec_FltSize(vInd1) * Vec_FltSize(vInd2) == Vec_FltSize(vValues) );
            Vec_FltForEachEntry( vValues, Entry, i )
            {
                int x = i % Vec_FltSize(vInd2);
                int y = i / Vec_FltSize(vInd2);
                Entry = Vec_FltEntry( vValues, x * Vec_FltSize(vInd1) + y );
                Vec_StrPutF_( vOut, Entry );
                if ( i % Vec_FltSize(vInd2) == Vec_FltSize(vInd2)-1 )
                    Vec_StrPut_( vOut );
            }
        }
    }
    Vec_StrPut_( vOut );
    for ( i = 0; i < 3; i++ ) 
        Vec_StrPutF_( vOut, 0 );
    for ( i = 0; i < 4; i++ ) 
        Vec_StrPutF_( vOut, 0 );
    for ( i = 0; i < 6; i++ ) 
        Vec_StrPutF_( vOut, 0 );
    Vec_FltFreeP( &vIndex1 );
    Vec_FltFreeP( &vIndex2 );
    Vec_FltFreeP( &vValues );
    Vec_StrPut_( vOut );
    Vec_StrPut_( vOut );
    return 1;
}